

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

void __thiscall
vkt::wsi::anon_unknown_0::populateSwapchainGroup
          (anon_unknown_0 *this,TestCaseGroup *testGroup,GroupParameters params)

{
  TestContext *testCtx;
  TestNode *node;
  pointer pcVar1;
  long lVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  TestContext *local_78;
  string local_70;
  string local_50;
  
  local_78 = params._0_8_;
  pcVar1 = (pointer)((ulong)testGroup & 0xffffffff);
  for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               (char *)((long)&
                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                       + (long)*(int *)((long)&
                                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                                       + lVar2)),&local_79);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_7a);
    testCtx = *(TestContext **)(this + 8);
    node = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,&local_70,&local_50);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bd9ac8;
    node[1].m_testCtx = local_78;
    node[1].m_name._M_dataplus._M_p = pcVar1;
    tcu::TestNode::addChild((TestNode *)this,node);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar1 = pcVar1 + 0x100000000;
  }
  return;
}

Assistant:

void populateSwapchainGroup (tcu::TestCaseGroup* testGroup, GroupParameters params)
{
	for (int dimensionNdx = 0; dimensionNdx < TEST_DIMENSION_LAST; ++dimensionNdx)
	{
		const TestDimension		testDimension	= (TestDimension)dimensionNdx;

		addFunctionCase(testGroup, getTestDimensionName(testDimension), "", params.function, TestParameters(params.wsiType, testDimension));
	}
}